

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

optional<pbrt::CameraRayDifferential> * __thiscall
pbrt::PerspectiveCamera::GenerateRayDifferential
          (optional<pbrt::CameraRayDifferential> *__return_storage_ptr__,PerspectiveCamera *this,
          CameraSample sample,SampledWavelengths *lambda)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar5;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  RayDifferential local_108;
  undefined1 local_a8 [16];
  anon_struct_8_0_00000001_for___align local_90;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  undefined8 uStack_7c;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float fStack_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  undefined8 uStack_44;
  undefined8 uStack_3c;
  
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)(sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y *
                                          (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][1])
                                   ),ZEXT416((uint)sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x)
                            ,ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[0][0]
                                    ));
  auVar21 = ZEXT816(0) << 0x40;
  auVar34 = vfmadd231ss_fma(auVar34,auVar21,
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[0][2])
                           );
  fVar26 = auVar34._0_4_ + (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][3];
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)(sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y *
                                          (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][1])
                                   ),ZEXT416((uint)sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x)
                            ,ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][0]
                                    ));
  auVar34 = vfmadd231ss_fma(auVar34,auVar21,
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][2])
                           );
  fVar18 = auVar34._0_4_ + (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][3];
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)(sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y *
                                          (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][1])
                                   ),ZEXT416((uint)sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x)
                            ,ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[2][0]
                                    ));
  auVar34 = vfmadd231ss_fma(auVar34,auVar21,
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[2][2])
                           );
  fVar20 = auVar34._0_4_ + (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][3];
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)(sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y *
                                          (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][1])
                                   ),ZEXT416((uint)sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x)
                            ,ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][0]
                                    ));
  auVar34 = vfmadd231ss_fma(auVar34,auVar21,
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][2])
                           );
  fVar25 = auVar34._0_4_ + (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][3];
  bVar10 = fVar25 == 1.0;
  auVar21 = vinsertps_avx(ZEXT416((uint)bVar10 * (int)fVar26 +
                                  (uint)!bVar10 * (int)(fVar26 / fVar25)),
                          ZEXT416((uint)bVar10 * (int)fVar18 +
                                  (uint)!bVar10 * (int)(fVar18 / fVar25)),0x10);
  fVar11 = auVar21._0_4_;
  auVar34._0_4_ = fVar11 * fVar11;
  fVar12 = auVar21._4_4_;
  auVar34._4_4_ = fVar12 * fVar12;
  fVar13 = auVar21._8_4_;
  fVar17 = auVar21._12_4_;
  auVar34._8_4_ = fVar13 * fVar13;
  auVar34._12_4_ = fVar17 * fVar17;
  auVar34 = vhaddps_avx(auVar34,auVar34);
  fVar18 = (float)((uint)bVar10 * (int)fVar20 + (uint)!bVar10 * (int)(fVar20 / fVar25));
  fVar26 = fVar18 * fVar18 + auVar34._0_4_;
  if (fVar26 < 0.0) {
    local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z = sqrtf(fVar26);
  }
  else {
    auVar34 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
    local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar34._0_4_;
  }
  auVar22._4_4_ = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar22._0_4_ = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar22._8_4_ = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar22._12_4_ = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar34 = vdivps_avx(auVar21,auVar22);
  local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
       fVar18 / local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(sample.time *
                                          (this->super_ProjectiveCamera).super_CameraBase.
                                          shutterClose)),ZEXT416((uint)(1.0 - sample.time)),
                            ZEXT416((uint)(this->super_ProjectiveCamera).super_CameraBase.
                                          shutterOpen));
  local_108.super_Ray.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(this->super_ProjectiveCamera).super_CameraBase.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar34);
  local_108.super_Ray.time = auVar21._0_4_;
  local_108.hasDifferentials = false;
  local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  fVar26 = (this->super_ProjectiveCamera).lensRadius;
  fVar20 = sample.pLens.super_Tuple2<pbrt::Point2,_float>.x;
  fVar25 = sample.pLens.super_Tuple2<pbrt::Point2,_float>.y;
  if (0.0 < fVar26) {
    auVar27._0_4_ = fVar20 + fVar20;
    auVar27._4_4_ = fVar25 + fVar25;
    auVar27._8_8_ = 0;
    auVar21._8_4_ = 0xbf800000;
    auVar21._0_8_ = 0xbf800000bf800000;
    auVar21._12_4_ = 0xbf800000;
    auVar21 = vaddps_avx512vl(auVar27,auVar21);
    auVar34 = vmovshdup_avx(auVar21);
    fVar23 = auVar21._0_4_;
    fVar19 = auVar34._0_4_;
    if ((fVar23 != 0.0) || (NAN(fVar23))) {
LAB_003bb836:
      auVar14._8_4_ = 0x7fffffff;
      auVar14._0_8_ = 0x7fffffff7fffffff;
      auVar14._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx512vl(auVar21,auVar14);
      auVar34 = vshufps_avx(auVar22,auVar22,0xf5);
      bVar10 = auVar34._0_4_ < auVar22._0_4_;
      auVar45._0_4_ = fVar23 / fVar19;
      auVar45._4_12_ = auVar21._4_12_;
      auVar34 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar45,ZEXT416(0x3fc90fdb));
      local_a8._4_12_ = auVar34._4_12_;
      local_a8._0_4_ =
           (uint)bVar10 * (int)((fVar19 / fVar23) * 0.7853982) + (uint)!bVar10 * auVar34._0_4_;
      fVar19 = (float)((uint)bVar10 * (int)fVar23 + (uint)!bVar10 * (int)fVar19);
      fVar23 = cosf((float)local_a8._0_4_);
      fVar24 = sinf((float)local_a8._0_4_);
      auVar34 = vinsertps_avx(ZEXT416((uint)(fVar19 * fVar23)),ZEXT416((uint)(fVar19 * fVar24)),0x10
                             );
    }
    else {
      auVar34 = ZEXT816(0) << 0x20;
      if ((fVar19 != 0.0) || (NAN(fVar19))) goto LAB_003bb836;
    }
    fVar23 = (this->super_ProjectiveCamera).focalDistance /
             local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
    fVar19 = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z * fVar23 +
             local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z;
    auVar35._0_4_ = fVar26 * auVar34._0_4_;
    auVar35._4_4_ = fVar26 * auVar34._4_4_;
    auVar35._8_4_ = fVar26 * auVar34._8_4_;
    auVar35._12_4_ = fVar26 * auVar34._12_4_;
    local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
    auVar28._0_4_ =
         local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x * fVar23 +
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
    auVar28._4_4_ =
         local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y * fVar23 +
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
    auVar28._8_4_ = fVar23 * 0.0 + 0.0;
    auVar28._12_4_ = fVar23 * 0.0 + 0.0;
    auVar21 = vsubps_avx(auVar28,auVar35);
    auVar29._0_4_ = auVar21._0_4_ * auVar21._0_4_;
    auVar29._4_4_ = auVar21._4_4_ * auVar21._4_4_;
    auVar29._8_4_ = auVar21._8_4_ * auVar21._8_4_;
    auVar29._12_4_ = auVar21._12_4_ * auVar21._12_4_;
    auVar34 = vhaddps_avx(auVar29,auVar29);
    local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar35);
    fVar26 = fVar19 * fVar19 + auVar34._0_4_;
    if (fVar26 < 0.0) {
      local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z = sqrtf(fVar26);
    }
    else {
      auVar34 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
      local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar34._0_4_;
    }
    auVar36._4_4_ = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar36._0_4_ = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar36._8_4_ = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar36._12_4_ = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar34 = vdivps_avx(auVar21,auVar36);
    local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
         fVar19 / local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
    local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar34);
  }
  fVar26 = (this->super_ProjectiveCamera).lensRadius;
  if (fVar26 <= 0.0) {
    local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z =
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z;
    local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x =
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
    local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y =
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
    local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z =
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z;
    local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x =
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
    local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y =
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
    fVar26 = fVar18 + (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar2 = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar7 = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar52._0_4_ = (float)uVar2 + fVar11;
    auVar52._4_4_ = (float)uVar7 + fVar12;
    auVar52._8_4_ = fVar13 + 0.0;
    auVar52._12_4_ = fVar17 + 0.0;
    auVar48._0_4_ = auVar52._0_4_ * auVar52._0_4_;
    auVar48._4_4_ = auVar52._4_4_ * auVar52._4_4_;
    auVar48._8_4_ = auVar52._8_4_ * auVar52._8_4_;
    auVar48._12_4_ = auVar52._12_4_ * auVar52._12_4_;
    auVar34 = vhaddps_avx(auVar48,auVar48);
    fVar20 = auVar34._0_4_ + fVar26 * fVar26;
    if (fVar20 < 0.0) {
      local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = sqrtf(fVar20);
    }
    else {
      auVar34 = vsqrtss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
      local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = auVar34._0_4_;
    }
    auVar40._4_4_ = local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar40._0_4_ = local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar40._8_4_ = local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar40._12_4_ = local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar34 = vdivps_avx(auVar52,auVar40);
    local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z =
         fVar26 / local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
    local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar34);
    uVar3 = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar8 = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar51._0_4_ = (float)uVar3 + fVar11;
    auVar51._4_4_ = (float)uVar8 + fVar12;
    auVar51._8_4_ = fVar13 + 0.0;
    auVar51._12_4_ = fVar17 + 0.0;
    fVar18 = fVar18 + (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar31._0_4_ = auVar51._0_4_ * auVar51._0_4_;
    auVar31._4_4_ = auVar51._4_4_ * auVar51._4_4_;
    auVar31._8_4_ = auVar51._8_4_ * auVar51._8_4_;
    auVar31._12_4_ = auVar51._12_4_ * auVar51._12_4_;
    auVar34 = vhaddps_avx(auVar31,auVar31);
    fVar26 = auVar34._0_4_ + fVar18 * fVar18;
    goto LAB_003bbcf3;
  }
  auVar30._0_4_ = fVar20 + fVar20;
  auVar30._4_4_ = fVar25 + fVar25;
  auVar30._8_8_ = 0;
  auVar15._8_4_ = 0xbf800000;
  auVar15._0_8_ = 0xbf800000bf800000;
  auVar15._12_4_ = 0xbf800000;
  auVar21 = vaddps_avx512vl(auVar30,auVar15);
  auVar34 = vmovshdup_avx(auVar21);
  fVar25 = auVar21._0_4_;
  fVar20 = auVar34._0_4_;
  if ((fVar25 != 0.0) || (NAN(fVar25))) {
LAB_003bb9bb:
    auVar16._8_4_ = 0x7fffffff;
    auVar16._0_8_ = 0x7fffffff7fffffff;
    auVar16._12_4_ = 0x7fffffff;
    auVar22 = vandps_avx512vl(auVar21,auVar16);
    auVar34 = vshufps_avx(auVar22,auVar22,0xf5);
    bVar10 = auVar34._0_4_ < auVar22._0_4_;
    auVar46._0_4_ = fVar25 / fVar20;
    auVar46._4_12_ = auVar21._4_12_;
    auVar34 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar46,ZEXT416(0x3fc90fdb));
    local_a8._4_12_ = auVar34._4_12_;
    local_a8._0_4_ =
         (uint)bVar10 * (int)((fVar20 / fVar25) * 0.7853982) + (uint)!bVar10 * auVar34._0_4_;
    fVar20 = (float)((uint)bVar10 * (int)fVar25 + (uint)!bVar10 * (int)fVar20);
    fVar25 = cosf((float)local_a8._0_4_);
    fVar19 = sinf((float)local_a8._0_4_);
    auVar34 = vinsertps_avx(ZEXT416((uint)(fVar20 * fVar25)),ZEXT416((uint)(fVar20 * fVar19)),0x10);
  }
  else {
    auVar34 = ZEXT416(0) << 0x20;
    if ((fVar20 != 0.0) || (NAN(fVar20))) goto LAB_003bb9bb;
  }
  fVar20 = fVar18 + (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z;
  uVar1 = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar6 = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar50._0_4_ = (float)uVar1 + fVar11;
  auVar50._4_4_ = (float)uVar6 + fVar12;
  auVar50._8_4_ = fVar13 + 0.0;
  auVar50._12_4_ = fVar17 + 0.0;
  auVar47._0_4_ = auVar50._0_4_ * auVar50._0_4_;
  auVar47._4_4_ = auVar50._4_4_ * auVar50._4_4_;
  auVar47._8_4_ = auVar50._8_4_ * auVar50._8_4_;
  auVar47._12_4_ = auVar50._12_4_ * auVar50._12_4_;
  auVar21 = vhaddps_avx(auVar47,auVar47);
  local_148._4_4_ = fVar26 * auVar34._4_4_;
  local_148._0_4_ = fVar26 * auVar34._0_4_;
  fStack_140 = fVar26 * auVar34._8_4_;
  fStack_13c = fVar26 * auVar34._12_4_;
  fVar26 = auVar21._0_4_ + fVar20 * fVar20;
  if (fVar26 < 0.0) {
    fVar26 = sqrtf(fVar26);
  }
  else {
    auVar34 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
    fVar26 = auVar34._0_4_;
  }
  auVar37._4_4_ = fVar26;
  auVar37._0_4_ = fVar26;
  auVar37._8_4_ = fVar26;
  auVar37._12_4_ = fVar26;
  auVar34 = vdivps_avx(auVar50,auVar37);
  fVar25 = (this->super_ProjectiveCamera).focalDistance / (fVar20 / fVar26);
  auVar38._0_4_ = auVar34._0_4_ * fVar25 + 0.0;
  auVar38._4_4_ = auVar34._4_4_ * fVar25 + 0.0;
  auVar38._8_4_ = auVar34._8_4_ * fVar25 + 0.0;
  auVar38._12_4_ = auVar34._12_4_ * fVar25 + 0.0;
  fVar26 = (fVar20 / fVar26) * fVar25 + 0.0;
  local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(_local_148);
  auVar21 = vsubps_avx(auVar38,_local_148);
  auVar39._0_4_ = auVar21._0_4_ * auVar21._0_4_;
  auVar39._4_4_ = auVar21._4_4_ * auVar21._4_4_;
  auVar39._8_4_ = auVar21._8_4_ * auVar21._8_4_;
  auVar39._12_4_ = auVar21._12_4_ * auVar21._12_4_;
  auVar34 = vhaddps_avx(auVar39,auVar39);
  fVar20 = fVar26 * fVar26 + auVar34._0_4_;
  if (fVar20 < 0.0) {
    local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = sqrtf(fVar20);
  }
  else {
    auVar34 = vsqrtss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
    local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = auVar34._0_4_;
  }
  auVar41._4_4_ = local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar41._0_4_ = local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar41._8_4_ = local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar41._12_4_ = local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar34 = vdivps_avx(auVar21,auVar41);
  local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z =
       fVar26 / local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar34);
  uVar4 = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar9 = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar49._0_4_ = (float)uVar4 + fVar11;
  auVar49._4_4_ = (float)uVar9 + fVar12;
  auVar49._8_4_ = fVar13 + 0.0;
  auVar49._12_4_ = fVar17 + 0.0;
  auVar32._0_4_ = auVar49._0_4_ * auVar49._0_4_;
  auVar32._4_4_ = auVar49._4_4_ * auVar49._4_4_;
  auVar32._8_4_ = auVar49._8_4_ * auVar49._8_4_;
  auVar32._12_4_ = auVar49._12_4_ * auVar49._12_4_;
  auVar34 = vhaddps_avx(auVar32,auVar32);
  fVar18 = fVar18 + (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar26 = auVar34._0_4_ + fVar18 * fVar18;
  if (fVar26 < 0.0) {
    fVar26 = sqrtf(fVar26);
  }
  else {
    auVar34 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
    fVar26 = auVar34._0_4_;
  }
  auVar42._4_4_ = fVar26;
  auVar42._0_4_ = fVar26;
  auVar42._8_4_ = fVar26;
  auVar42._12_4_ = fVar26;
  auVar34 = vdivps_avx(auVar49,auVar42);
  fVar20 = (this->super_ProjectiveCamera).focalDistance / (fVar18 / fVar26);
  auVar43._0_4_ = auVar34._0_4_ * fVar20 + 0.0;
  auVar43._4_4_ = auVar34._4_4_ * fVar20 + 0.0;
  auVar43._8_4_ = auVar34._8_4_ * fVar20 + 0.0;
  auVar43._12_4_ = auVar34._12_4_ * fVar20 + 0.0;
  fVar18 = (fVar18 / fVar26) * fVar20 + 0.0;
  uVar5 = vmovlps_avx(_local_148);
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar5;
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar5 >> 0x20);
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  auVar51 = vsubps_avx(auVar43,_local_148);
  auVar33._0_4_ = auVar51._0_4_ * auVar51._0_4_;
  auVar33._4_4_ = auVar51._4_4_ * auVar51._4_4_;
  auVar33._8_4_ = auVar51._8_4_ * auVar51._8_4_;
  auVar33._12_4_ = auVar51._12_4_ * auVar51._12_4_;
  auVar34 = vhaddps_avx(auVar33,auVar33);
  fVar26 = fVar18 * fVar18 + auVar34._0_4_;
LAB_003bbcf3:
  if (fVar26 < 0.0) {
    local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = sqrtf(fVar26);
  }
  else {
    auVar34 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
    local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = auVar34._0_4_;
  }
  auVar44._4_4_ = local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar44._0_4_ = local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar44._8_4_ = local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar44._12_4_ = local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar34 = vdivps_avx(auVar51,auVar44);
  local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z =
       fVar18 / local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar34);
  local_108.hasDifferentials = true;
  AnimatedTransform::operator()
            ((RayDifferential *)&local_90,(AnimatedTransform *)this,&local_108,(Float *)0x0);
  __return_storage_ptr__->set = true;
  (__return_storage_ptr__->optionalValue).__align = local_90;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) = CONCAT44(fStack_84,fStack_88);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xc) = CONCAT44(fStack_80,fStack_84);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x14) = uStack_7c;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    *)((long)&__return_storage_ptr__->optionalValue + 0x20))->bits = local_70.bits;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = local_68;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uStack_60;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x38) = CONCAT44(fStack_54,fStack_58);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x40) = CONCAT44(fStack_4c,fStack_50);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x3c) = CONCAT44(fStack_50,fStack_54);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x44) = CONCAT44(fStack_48,fStack_4c);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x4c) = uStack_44;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x54) = uStack_3c;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0x3f8000003f800000;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0x3f8000003f800000;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRayDifferential> PerspectiveCamera::GenerateRayDifferential(
    CameraSample sample, SampledWavelengths &lambda) const {
    // Compute raster and camera sample positions
    Point3f pFilm = Point3f(sample.pFilm.x, sample.pFilm.y, 0);
    Point3f pCamera = cameraFromRaster(pFilm);
    Vector3f dir = Normalize(Vector3f(pCamera.x, pCamera.y, pCamera.z));
    RayDifferential ray(Point3f(0, 0, 0), dir, SampleTime(sample.time), medium);
    // Modify ray for depth of field
    if (lensRadius > 0) {
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute point on plane of focus
        Float ft = focalDistance / ray.d.z;
        Point3f pFocus = ray(ft);

        // Update ray for effect of lens
        ray.o = Point3f(pLens.x, pLens.y, 0);
        ray.d = Normalize(pFocus - ray.o);
    }

    // Compute offset rays for _PerspectiveCamera_ ray differentials
    if (lensRadius > 0) {
        // Compute _PerspectiveCamera_ ray differentials accounting for lens
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute $x$ ray differential for _PerspectiveCamera_ with lens
        Vector3f dx = Normalize(Vector3f(pCamera + dxCamera));
        Float ft = focalDistance / dx.z;
        Point3f pFocus = Point3f(0, 0, 0) + (ft * dx);
        ray.rxOrigin = Point3f(pLens.x, pLens.y, 0);
        ray.rxDirection = Normalize(pFocus - ray.rxOrigin);

        // Compute $y$ ray differential for _PerspectiveCamera_ with lens
        Vector3f dy = Normalize(Vector3f(pCamera + dyCamera));
        ft = focalDistance / dy.z;
        pFocus = Point3f(0, 0, 0) + (ft * dy);
        ray.ryOrigin = Point3f(pLens.x, pLens.y, 0);
        ray.ryDirection = Normalize(pFocus - ray.ryOrigin);

    } else {
        ray.rxOrigin = ray.ryOrigin = ray.o;
        ray.rxDirection = Normalize(Vector3f(pCamera) + dxCamera);
        ray.ryDirection = Normalize(Vector3f(pCamera) + dyCamera);
    }

    ray.hasDifferentials = true;
    return CameraRayDifferential{RenderFromCamera(ray)};
}